

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O2

void __thiscall vera::Mesh::invertNormals(Mesh *this)

{
  pointer this_00;
  
  for (this_00 = (this->m_normals).
                 super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      this_00 !=
      (this->m_normals).
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; this_00 = this_00 + 1) {
    glm::vec<3,float,(glm::qualifier)0>::operator*=((vec<3,float,(glm::qualifier)0> *)this_00,-1.0);
  }
  return;
}

Assistant:

void Mesh::invertNormals() {
    for (std::vector<glm::vec3>::iterator it = m_normals.begin(); it != m_normals.end(); ++it)
        *it *= -1.0f;
}